

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string text;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"hello\nworld!\r\nfoo\rbar\n",&local_29);
  print_lines1(&local_28);
  print_lines2(&local_28);
  print_lines3(&local_28);
  print_lines4(&local_28);
  print_lines5(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main()
{
  const std::string text = "hello\nworld!\r\nfoo\rbar\n";

  print_lines1(text);
  print_lines2(text);
  print_lines3(text);
  print_lines4(text);
  print_lines5(text);
}